

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cn2Kernel.cpp
# Opt level: O0

void __thiscall
xmrig::Cn2Kernel::setArgs
          (Cn2Kernel *this,cl_mem scratchpads,cl_mem states,
          vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *branches,uint32_t threads)

{
  size_type sVar1;
  vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *in_RCX;
  void *in_RDI;
  size_t unaff_retaddr;
  uint32_t in_stack_0000000c;
  OclKernel *in_stack_00000010;
  uint32_t i;
  undefined4 local_28;
  
  OclKernel::setArg(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI);
  OclKernel::setArg(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI);
  OclKernel::setArg(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI);
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::size(in_RCX);
    if (sVar1 <= local_28) break;
    std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::operator[](in_RCX,(ulong)local_28);
    OclKernel::setArg(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void xmrig::Cn2Kernel::setArgs(cl_mem scratchpads, cl_mem states, const std::vector<cl_mem> &branches, uint32_t threads)
{
    setArg(0, sizeof(cl_mem), &scratchpads);
    setArg(1, sizeof(cl_mem), &states);
    setArg(6, sizeof(uint32_t), &threads);

    for (uint32_t i = 0; i < branches.size(); ++i) {
        setArg(i + 2, sizeof(cl_mem), &branches[i]);
    }
}